

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastV8R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  RepeatedField<bool> *this;
  ParseContext *pPVar1;
  byte *pbVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  TcParseTableBase *this_00;
  uchar uVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint uVar9;
  char *pcVar10;
  uint *puVar11;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  bool local_221;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_1c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b8;
  byte local_1aa;
  uchar local_1a9;
  bool tmp;
  RepeatedField<bool> *pRStack_1a8;
  uchar expected_tag;
  RepeatedField<bool> *field;
  uint64_t local_198;
  TcParseTableBase *local_190;
  ParseContext *local_188;
  byte *local_180;
  MessageLite *local_178;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_170;
  TcFieldData local_168;
  TcFieldData local_160;
  undefined1 local_151;
  uint64_t uStack_150;
  bool always_return;
  TcParseTableBase *local_148;
  ParseContext *local_140;
  byte *local_138;
  MessageLite *local_130;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_128;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_120;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_118;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  byte local_21;
  uchar byte;
  byte *local_18;
  byte *local_10;
  
  local_198 = hasbits;
  local_190 = table;
  local_188 = ctx;
  local_180 = (byte *)ptr;
  local_178 = msg;
  local_170 = data.field_0;
  uVar5 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_170);
  pMVar3 = local_178;
  pbVar2 = local_180;
  pPVar1 = local_188;
  if (uVar5 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar10 = MiniParse(pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)field,local_190,local_198);
    return pcVar10;
  }
  uVar7 = TcFieldData::offset((TcFieldData *)&local_170);
  pRStack_1a8 = RefAt<google::protobuf::RepeatedField<bool>>(pMVar3,(ulong)uVar7);
  local_1a9 = UnalignedLoad<unsigned_char>((char *)local_180);
  do {
    pMVar3 = local_178;
    pPVar1 = local_188;
    this = pRStack_1a8;
    local_10 = local_180 + 2;
    local_21 = local_180[1];
    local_221 = 1 < local_21;
    if (local_221) {
      local_18 = local_10;
      if ((local_21 & 0x80) != 0) {
        local_21 = local_21 + 0x80 | *local_10;
        local_18 = local_180 + 3;
        if ((local_21 & 0x80) != 0) {
          local_21 = local_21 + 0x80 | local_180[3];
          local_18 = local_180 + 4;
          if ((local_21 & 0x80) != 0) {
            local_21 = local_21 + 0x80 | local_180[4];
            local_18 = local_180 + 5;
            if ((local_21 & 0x80) != 0) {
              local_21 = local_21 + 0x80 | local_180[5];
              local_18 = local_180 + 6;
              if ((local_21 & 0x80) != 0) {
                local_21 = local_21 + 0x80 | local_180[6];
                local_18 = local_180 + 7;
                if ((local_21 & 0x80) != 0) {
                  local_21 = local_21 + 0x80 | local_180[7];
                  local_18 = local_180 + 8;
                  if ((local_21 & 0x80) != 0) {
                    local_21 = local_21 + 0x80 | local_180[8];
                    local_18 = local_180 + 9;
                    if ((local_21 & 0x80) != 0) {
                      local_21 = local_21 + 0x80 | local_180[9];
                      local_18 = local_180 + 10;
                      if ((local_21 & 0x80) != 0) {
                        local_18 = local_180 + 0xb;
                        local_21 = local_21 + 0x80 | local_180[10] & 0x81;
                        if ((local_21 & 0x80) != 0) {
                          local_10 = (byte *)0x0;
                          local_21 = local_1aa;
                          goto LAB_0079ab3d;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_10 = local_18;
      local_21 = local_21 != 0;
    }
LAB_0079ab3d:
    local_1aa = local_21;
    local_180 = local_10;
    if (local_10 == (byte *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_1b8);
      pcVar10 = Error(pMVar3,(char *)0x0,pPVar1,(TcFieldData)local_1b8,local_190,local_198);
      return pcVar10;
    }
    bVar6 = internal::(anonymous_namespace)::ZigZagDecodeHelper<bool,false>((bool)(local_1aa & 1));
    RepeatedField<bool>::Add(this,bVar6);
    bVar6 = EpsCopyInputStream::DataAvailable
                      (&local_188->super_EpsCopyInputStream,(char *)local_180);
    pMVar3 = local_178;
    pbVar2 = local_180;
    if (((bVar6 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_1c0);
      if (local_190->has_bits_offset != 0) {
        uVar9 = (uint)local_198;
        puVar11 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_190->has_bits_offset);
        *puVar11 = uVar9 | *puVar11;
      }
      return (char *)pbVar2;
    }
    uVar5 = UnalignedLoad<unsigned_char>((char *)local_180);
    local_130 = local_178;
    local_138 = local_180;
    local_140 = local_188;
    if (uVar5 != local_1a9) {
      TcFieldData::TcFieldData(&data_local);
      local_128 = data_local.field_0;
      local_148 = local_190;
      uStack_150 = local_198;
      local_151 = 0;
      bVar6 = EpsCopyInputStream::DataAvailable
                        (&local_140->super_EpsCopyInputStream,(char *)local_138);
      pMVar3 = local_130;
      pbVar2 = local_138;
      pPVar1 = local_140;
      if (!bVar6) {
        TcFieldData::TcFieldData(&local_160);
        if (local_148->has_bits_offset != 0) {
          uVar9 = (uint)uStack_150;
          puVar11 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_148->has_bits_offset);
          *puVar11 = uVar9 | *puVar11;
        }
        return (char *)pbVar2;
      }
      TcFieldData::TcFieldData(&local_168);
      this_00 = local_148;
      uVar4 = uStack_150;
      uVar8 = UnalignedLoad<unsigned_short>((char *)pbVar2);
      uVar12 = (ulong)(int)((uint)uVar8 & (uint)this_00->fast_idx_mask);
      if ((uVar12 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(this_00,uVar12 >> 3);
      local_118.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar8;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_120.data = local_118.data;
      pcVar10 = (*UNRECOVERED_JUMPTABLE)
                          (pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)local_118,this_00,uVar4);
      return pcVar10;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}